

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

void readScanLine(InputPart *in,FrameBuffer *buf,vector<double,_std::allocator<double>_> *perf)

{
  time_point end_00;
  vector<double,_std::allocator<double>_> *this;
  value_type_conflict1 *in_RDX;
  FrameBuffer *in_RDI;
  time_point end;
  Box2i dw;
  time_point start;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffffa8;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffffb0;
  time_point in_stack_ffffffffffffffc0;
  undefined4 local_2c;
  
  end_00.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  Imf_3_4::InputPart::header();
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Imf_3_4::InputPart::setFrameBuffer(in_RDI);
  Imf_3_4::InputPart::readPixels((int)in_RDI,local_2c);
  this = (vector<double,_std::allocator<double>_> *)std::chrono::_V2::steady_clock::now();
  timing(in_stack_ffffffffffffffc0,end_00);
  std::vector<double,_std::allocator<double>_>::push_back(this,in_RDX);
  return;
}

Assistant:

void
readScanLine (InputPart& in, FrameBuffer& buf, vector<double>& perf)
{
    steady_clock::time_point start = steady_clock::now ();
    Box2i                    dw    = in.header ().dataWindow ();
    in.setFrameBuffer (buf);
    in.readPixels (dw.min.y, dw.max.y);
    steady_clock::time_point end = steady_clock::now ();
    perf.push_back (timing (start, end));
}